

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::updateTransitionMatrices
          (EigenDecompositionSquare<float,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,float **transitionMatrices,int count)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R9;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int k;
  float sum;
  int j_2;
  int i_1;
  int j_1;
  float expatsinbt;
  float expatcosbt;
  float expat;
  float b;
  int i2;
  int j;
  float tmp;
  int i;
  float distance;
  int l;
  int n;
  double edgeLength;
  float *transitionMat;
  int u;
  float *EvalImag;
  float *Eval;
  float *Evec;
  float *Ievc;
  int local_a8;
  float local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_80;
  int local_78;
  int local_70;
  int local_6c;
  int local_54;
  
  lVar2 = *(long *)(*(long *)(in_RDI + 0x48) + (long)in_ESI * 8);
  lVar3 = *(long *)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8);
  lVar4 = *(long *)(*(long *)(in_RDI + 8) + (long)in_ESI * 8);
  lVar8 = lVar4 + (long)*(int *)(in_RDI + 0x10) * 4;
  for (local_54 = 0; local_54 < in_stack_00000018; local_54 = local_54 + 1) {
    lVar5 = *(long *)(in_stack_00000010 + (long)*(int *)(in_RDX + (long)local_54 * 4) * 8);
    dVar1 = *(double *)(in_R9 + (long)local_54 * 8);
    local_6c = 0;
    for (local_70 = 0; local_70 < *(int *)(in_RDI + 0x18); local_70 = local_70 + 1) {
      fVar9 = (float)(*(double *)(in_stack_00000008 + (long)local_70 * 8) * dVar1);
      for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x10); local_78 = local_78 + 1) {
        if (((*(byte *)(in_RDI + 0x50) & 1) == 0) ||
           ((fVar11 = *(float *)(lVar8 + (long)local_78 * 4), fVar11 == 0.0 && (!NAN(fVar11))))) {
          dVar12 = exp((double)(*(float *)(lVar4 + (long)local_78 * 4) * fVar9));
          for (local_80 = 0; local_80 < *(int *)(in_RDI + 0x10); local_80 = local_80 + 1) {
            *(float *)(*(long *)(in_RDI + 0x28) +
                      (long)(local_78 * *(int *)(in_RDI + 0x10) + local_80) * 4) =
                 *(float *)(lVar2 + (long)(local_78 * *(int *)(in_RDI + 0x10) + local_80) * 4) *
                 (float)dVar12;
          }
        }
        else {
          iVar7 = local_78 + 1;
          fVar11 = *(float *)(lVar8 + (long)local_78 * 4);
          dVar12 = exp((double)(*(float *)(lVar4 + (long)local_78 * 4) * fVar9));
          dVar13 = cos((double)(fVar11 * fVar9));
          fVar10 = (float)((double)(float)dVar12 * dVar13);
          dVar13 = sin((double)(fVar11 * fVar9));
          fVar11 = (float)((double)(float)dVar12 * dVar13);
          for (local_98 = 0; local_98 < *(int *)(in_RDI + 0x10); local_98 = local_98 + 1) {
            auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar2 + (long)(local_78 *
                                                                      *(int *)(in_RDI + 0x10) +
                                                                     local_98) * 4)),
                                     ZEXT416((uint)fVar10),
                                     ZEXT416((uint)(fVar11 * *(float *)(lVar2 + (long)(iVar7 * *(int
                                                                                                 *)(
                                                  in_RDI + 0x10) + local_98) * 4))));
            *(int *)(*(long *)(in_RDI + 0x28) +
                    (long)(local_78 * *(int *)(in_RDI + 0x10) + local_98) * 4) = auVar6._0_4_;
            auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar2 + (long)(iVar7 * *(int *)(in_RDI + 0x10
                                                                                      ) + local_98)
                                                               * 4)),ZEXT416((uint)fVar10),
                                     ZEXT416((uint)-(fVar11 * *(float *)(lVar2 + (long)(local_78 *
                                                                                        *(int *)(
                                                  in_RDI + 0x10) + local_98) * 4))));
            *(int *)(*(long *)(in_RDI + 0x28) +
                    (long)(iVar7 * *(int *)(in_RDI + 0x10) + local_98) * 4) = auVar6._0_4_;
          }
          local_78 = local_78 + 1;
        }
      }
      for (local_9c = 0; local_9c < *(int *)(in_RDI + 0x10); local_9c = local_9c + 1) {
        for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0x10); local_a0 = local_a0 + 1) {
          local_a4 = 0.0;
          for (local_a8 = 0; local_a8 < *(int *)(in_RDI + 0x10); local_a8 = local_a8 + 1) {
            auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                      (long)(local_a8 * *(int *)(in_RDI + 0x10) +
                                                            local_a0) * 4)),
                                     ZEXT416(*(uint *)(lVar3 + (long)(local_9c *
                                                                      *(int *)(in_RDI + 0x10) +
                                                                     local_a8) * 4)),
                                     ZEXT416((uint)local_a4));
            local_a4 = auVar6._0_4_;
          }
          if (local_a4 <= 0.0) {
            *(undefined4 *)(lVar5 + (long)local_6c * 4) = 0;
          }
          else {
            *(float *)(lVar5 + (long)local_6c * 4) = local_a4;
          }
          local_6c = local_6c + 1;
        }
        *(undefined4 *)(lVar5 + (long)local_6c * 4) = 0x3f800000;
        local_6c = local_6c + 1;
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        const double* categoryRates,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

	const REALTYPE* Ievc = gIMatrices[eigenIndex];
	const REALTYPE* Evec = gEMatrices[eigenIndex];
	const REALTYPE* Eval = gEigenValues[eigenIndex];
	const REALTYPE* EvalImag = Eval + kStateCount;
    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
			const REALTYPE distance = categoryRates[l] * edgeLength;
        	for(int i=0; i<kStateCount; i++) {
        		if (!isComplex || EvalImag[i] == 0) {
        			const REALTYPE tmp = exp(Eval[i] * distance);
        			for(int j=0; j<kStateCount; j++) {
        				matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
        			}
        		} else {
        			// 2 x 2 conjugate block
        			int i2 = i + 1;
        			const REALTYPE b = EvalImag[i];
        			const REALTYPE expat = exp(Eval[i] * distance);
        			const REALTYPE expatcosbt = expat * cos(b * distance);
        			const REALTYPE expatsinbt = expat * sin(b * distance);
        			for(int j=0; j<kStateCount; j++) {
        				matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
        						                      expatsinbt * Ievc[i2*kStateCount+j];
        				matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
												      expatsinbt * Ievc[ i*kStateCount+j];
        			}
        			i++; // processed two conjugate rows
        		}
        	}

#ifdef DEBUG_COMPLEX
           	fprintf(stderr,"[");
            	for(int i=0; i<16; i++)
            		fprintf(stderr," %7.5e,",matrixTmp[i]);
            	fprintf(stderr,"] -- complex debug\n");
            	exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
        	int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}